

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Channel.h
# Opt level: O0

void __thiscall tt::net::Channel::handleEvents(Channel *this)

{
  bool bVar1;
  Channel *this_local;
  
  this->m_events = 0;
  if (((this->m_revents & 0x10) == 0) || ((this->m_revents & 1) != 0)) {
    if ((this->m_revents & 8) == 0) {
      if ((this->m_revents & 0x2003) != 0) {
        handleRead(this);
      }
      if ((this->m_revents & 4) != 0) {
        handleWrite(this);
      }
      handleConn(this);
    }
    else {
      bVar1 = std::function::operator_cast_to_bool((function *)&this->m_errorHandler);
      if (bVar1) {
        std::function<void_()>::operator()(&this->m_errorHandler);
      }
      this->m_events = 0;
    }
  }
  else {
    this->m_events = 0;
  }
  return;
}

Assistant:

void handleEvents(){
		
		m_events = 0;
		
		if((m_revents & EPOLLHUP) && !(m_revents & EPOLLIN)){
			m_events = 0;

			return ;
		}

		if(m_revents & EPOLLERR){
			if(m_errorHandler) m_errorHandler();

			m_events = 0;

			return ;
		}

		if(m_revents & (EPOLLIN | EPOLLPRI | EPOLLRDHUP)){
			handleRead();
		}

		if(m_revents & EPOLLOUT){
			handleWrite();
		}

		handleConn();
	}